

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

size_t __thiscall toml::basic_value<toml::type_config>::size(basic_value<toml::type_config> *this)

{
  value_t vVar1;
  long *plVar2;
  size_t sVar3;
  type_error *this_00;
  value_t t;
  allocator<char> local_191;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_130;
  source_location local_110;
  source_location local_98;
  
  vVar1 = this->type_;
  if (vVar1 == string) {
    sVar3 = (this->field_1).string_.value._M_string_length;
  }
  else if (vVar1 == table) {
    sVar3 = *(size_t *)((this->field_1).integer_.value + 0x18);
  }
  else {
    if (vVar1 != array) {
      this_00 = (type_error *)__cxa_allocate_exception(0xa0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"toml::value::size(): bad_cast to container types",&local_191)
      ;
      source_location::source_location(&local_98,&this->region_);
      to_string_abi_cxx11_(&local_190,(toml *)(ulong)this->type_,t);
      std::operator+(&local_170,"the actual type is ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190
                    );
      format_error<>(&local_130,&local_150,&local_98,(string *)&local_170);
      source_location::source_location(&local_110,&this->region_);
      type_error::type_error(this_00,&local_130,&local_110);
      __cxa_throw(this_00,&type_error::typeinfo,type_error::~type_error);
    }
    plVar2 = (long *)(this->field_1).integer_.value;
    sVar3 = (plVar2[1] - *plVar2) / 200;
  }
  return sVar3;
}

Assistant:

std::size_t size() const
    {
        switch(this->type_)
        {
            case value_t::array:
            {
                return this->as_array(std::nothrow).size();
            }
            case value_t::table:
            {
                return this->as_table(std::nothrow).size();
            }
            case value_t::string:
            {
                return this->as_string(std::nothrow).size();
            }
            default:
            {
                throw type_error(format_error(
                    "toml::value::size(): bad_cast to container types",
                    this->location(),
                    "the actual type is " + to_string(this->type_)
                    ), this->location());
            }
        }
    }